

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_set.c
# Opt level: O3

void set_iterator_next(set_iterator it)

{
  ulong uVar1;
  ulong uVar2;
  pair *pppVar3;
  
  if (it != (set_iterator)0x0) {
    uVar2 = it->current_bucket;
    uVar1 = it->s->capacity;
    if (uVar2 < uVar1) {
      pppVar3 = &it->s->buckets[uVar2].pairs;
      do {
        uVar2 = uVar2 + 1;
        if (((*pppVar3 != (pair)0x0) && (((bucket_type *)(pppVar3 + -2))->count != 0)) &&
           (it->current_pair < ((bucket_type *)(pppVar3 + -2))->count)) {
          it->current_pair = it->current_pair + 1;
          return;
        }
        it->current_bucket = uVar2;
        pppVar3 = pppVar3 + 3;
      } while (uVar2 != uVar1);
    }
  }
  return;
}

Assistant:

void set_iterator_next(set_iterator it)
{
	if (it != NULL)
	{
		for (; it->current_bucket < it->s->capacity; ++it->current_bucket)
		{
			bucket b = &it->s->buckets[it->current_bucket];

			if (b->pairs != NULL && b->count > 0)
			{
				for (; it->current_pair < b->count; ++it->current_pair)
				{
					pair p = &b->pairs[it->current_pair];

					if (p != NULL)
					{
						++it->current_pair;

						return;
					}
				}
			}
		}
	}
}